

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ClassArray<ON_MaterialRef> *a)

{
  bool bVar1;
  undefined8 in_RAX;
  ON_MaterialRef *this_00;
  int iVar2;
  int count;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ON_ClassArray<ON_MaterialRef>::Empty(a);
  bVar1 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_28 + 4));
  if (bVar1) {
    ON_ClassArray<ON_MaterialRef>::SetCapacity(a,(long)uStack_28._4_4_);
    if (bVar1 && 0 < uStack_28._4_4_) {
      iVar2 = 1;
      do {
        this_00 = ON_ClassArray<ON_MaterialRef>::AppendNew(a);
        bVar1 = ON_MaterialRef::Read(this_00,this);
        if (uStack_28._4_4_ <= iVar2) {
          return bVar1;
        }
        iVar2 = iVar2 + 1;
      } while (bVar1);
    }
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ReadArray( ON_ClassArray<ON_MaterialRef>& a)
{
  a.Empty();
  int i, count;
  bool rc = ReadInt( &count );
  if (rc)
  {
    a.SetCapacity(count);
    for  ( i = 0; i < count && rc; i++ )
    {
      rc = a.AppendNew().Read(*this);
    }
  }
  return rc;
}